

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::emitUnreachable
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this)

{
  Function *pFVar1;
  Expression *local_18;
  
  pFVar1 = this[4].func;
  local_18 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        &((this[2].func)->epilogLocation)._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_parent,0x10,8);
  local_18->_id = UnreachableId;
  (local_18->type).id = 1;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &pFVar1[-1].delimiterLocations._M_h._M_single_bucket,&local_18);
  return;
}

Assistant:

void emitUnreachable() { static_cast<SubType*>(this)->emitUnreachable(); }